

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

void __thiscall
acto::actor::fun_handler_t<msg_out,_acto::actor_ref,_const_msg_out_&>::fun_handler_t
          (fun_handler_t<msg_out,_acto::actor_ref,_const_msg_out_&> *this,F *func)

{
  bool bVar1;
  F *func_local;
  fun_handler_t<msg_out,_acto::actor_ref,_const_msg_out_&> *this_local;
  
  handler_t::handler_t(&this->super_handler_t);
  (this->super_handler_t)._vptr_handler_t = (_func_int **)&PTR__fun_handler_t_0012a768;
  std::function<void_(acto::actor_ref,_const_msg_out_&)>::function(&this->func_,func);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->func_);
  if (!bVar1) {
    __assert_fail("func_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/include/acto/acto.h"
                  ,0x165,
                  "acto::actor::fun_handler_t<msg_out, acto::actor_ref, const msg_out &>::fun_handler_t(F &&) [M = msg_out, Args = <acto::actor_ref, const msg_out &>]"
                 );
  }
  return;
}

Assistant:

fun_handler_t(F&& func) noexcept
      : func_(std::move(func)) {
      assert(func_);
    }